

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O3

int sptk::snack::xlpc(int lpc_ord,float lpc_stabl,int wsize,float *data,float *lpca,float *ar,
                     float *lpck,float *normerr,float *rms,float preemp,int type,int *nwindp,
                     float **dwindp,int *wsizep,float **windp)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  int iVar4;
  float *r;
  float fVar5;
  double dVar6;
  float k [100];
  float a [101];
  float local_518;
  float local_514;
  float *local_510;
  float *local_508;
  float *local_500;
  float local_4f8 [104];
  float local_358 [100];
  float local_1c8 [102];
  
  iVar4 = 0;
  if (((lpc_ord < 0x65) && (iVar4 = 0, 0 < wsize)) && (data != (float *)0x0)) {
    pfVar1 = *dwindp;
    local_510 = ar;
    local_508 = lpca;
    if (*nwindp != wsize) {
      if (pfVar1 == (float *)0x0) {
        pfVar1 = (float *)malloc((ulong)(uint)wsize << 2);
      }
      else {
        pfVar1 = (float *)realloc(pfVar1,(ulong)(uint)wsize << 2);
      }
      if (pfVar1 == (float *)0x0) {
        xlpc();
        return 0;
      }
      *nwindp = wsize;
      *dwindp = pfVar1;
    }
    window(data,pfVar1,wsize,preemp,type,wsizep,windp);
    r = local_510;
    if (local_510 == (float *)0x0) {
      r = local_4f8;
    }
    local_500 = local_358;
    if (lpck != (float *)0x0) {
      local_500 = lpck;
    }
    pfVar2 = local_508;
    if (local_508 == (float *)0x0) {
      pfVar2 = local_1c8;
    }
    xautoc(wsize,pfVar1,lpc_ord,r,&local_514);
    if (1.0 < lpc_stabl) {
      dVar6 = exp(((double)lpc_stabl / 20.0) * -2.302585092994046);
      if (0 < lpc_ord) {
        uVar3 = 1;
        do {
          local_4f8[uVar3] = r[uVar3] * (float)(1.0 / (dVar6 + 1.0));
          uVar3 = uVar3 + 1;
        } while (lpc_ord + 1 != uVar3);
      }
      local_4f8[0] = *r;
      r = local_4f8;
      if (-1 < lpc_ord && local_510 != (float *)0x0) {
        memcpy(local_510,r,(ulong)(uint)lpc_ord * 4 + 4);
      }
    }
    pfVar1 = local_1c8;
    if (local_508 != (float *)0x0) {
      pfVar1 = local_508;
    }
    xdurbin(r,local_500,pfVar1 + 1,lpc_ord,&local_518);
    if (type - 1U < 3) {
      fVar5 = *(float *)(&DAT_0012b7b8 + (ulong)(type - 1U) * 4);
    }
    else {
      fVar5 = 1.0;
    }
    *pfVar2 = 1.0;
    if (rms != (float *)0x0) {
      *rms = local_514 / fVar5;
    }
    iVar4 = 1;
    if (normerr != (float *)0x0) {
      *normerr = local_518;
    }
  }
  return iVar4;
}

Assistant:

int xlpc(int lpc_ord, float lpc_stabl, int wsize, float *data, float *lpca,
         float *ar, float *lpck, float *normerr, float *rms, float preemp,
         int type, int *nwindp, float **dwindp, int *wsizep, float **windp)
#endif
{
#if 0
  static float *dwind=NULL;
  static int nwind=0;
#else
  float *dwind=*dwindp;
  int nwind=*nwindp;
#endif
  float rho[BIGSORD+1], k[BIGSORD], a[BIGSORD+1],*r,*kp,*ap,en,er,wfact=1.0;

  if((wsize <= 0) || (!data) || (lpc_ord > BIGSORD)) return(FALSE);
  
  if(nwind != wsize) {
    if(dwind) dwind = (float*)ckrealloc((void *)dwind,wsize*sizeof(float));
    else dwind = (float*)ckalloc(wsize*sizeof(float));
    if(!dwind) {
      Fprintf(stderr,"Can't allocate scratch memory in lpc()\n");
      return(FALSE);
    }
    nwind = wsize;
#if 1
    *nwindp = nwind;
    *dwindp = dwind;
#endif
  }
  
#if 0
  window(data, dwind, wsize, preemp, type);
#else
  window(data, dwind, wsize, preemp, type, wsizep, windp);
#endif
  if(!(r = ar)) r = rho;	/* Permit optional return of the various */
  if(!(kp = lpck)) kp = k;	/* coefficients and intermediate results. */
  if(!(ap = lpca)) ap = a;
  xautoc( wsize, dwind, lpc_ord, r, &en );
  if(lpc_stabl > 1.0) {	/* add a little to the diagonal for stability */
    int i;
    float ffact;
    ffact = (float) (1.0/(1.0 + exp((-lpc_stabl/20.0) * log(10.0))));
    for(i=1; i <= lpc_ord; i++) rho[i] = ffact * r[i];
    *rho = *r;
    r = rho;
    if(ar)
      for(i=0;i<=lpc_ord; i++) ar[i] = r[i];
  }
  xdurbin ( r, kp, &ap[1], lpc_ord, &er);
  switch(type) {		/* rms correction for window */
  case 0:
    wfact = 1.0;		/* rectangular */
    break;
  case 1:
    wfact = .630397f;		/* Hamming */
    break;
  case 2:
    wfact = .443149f;		/* (.5 - .5*cos)^4 */
    break;
  case 3:
    wfact = .612372f;		/* Hanning */
    break;
  }
  *ap = 1.0;
  if(rms) *rms = en/wfact;
  if(normerr) *normerr = er;
  return(TRUE);
}